

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

double Abc_SccEnumCost(Abc_TgMan_t *pMan,Abc_SccCost_t c)

{
  int iVar1;
  int iVar2;
  Abc_TgMan_t *pMan_local;
  int iStack_1c;
  Abc_SccCost_t c_local;
  
  iVar2 = c.cPerm;
  iVar1 = pMan->nAlgorithm;
  iStack_1c = c.cPhase;
  if (iVar1 == 0) {
    register0x00001200 = (double)iVar2 * 0.01144 + (double)iStack_1c * 1.09 + (double)pMan->nVars;
  }
  else if (iVar1 == 1) {
    register0x00001200 = (double)iVar2 * 0.00797 + (double)iStack_1c * 0.855 + (double)pMan->nVars;
  }
  else if (iVar1 == 2) {
    register0x00001200 =
         ((double)iVar2 * 0.00855 + (double)pMan->nVars * 0.94 + (double)iStack_1c * 0.885) - 20.59;
  }
  else {
    stack0xfffffffffffffff0 = 0.0;
  }
  return stack0xfffffffffffffff0;
}

Assistant:

static inline double Abc_SccEnumCost(Abc_TgMan_t * pMan, Abc_SccCost_t c)
{
    switch (pMan->nAlgorithm)
    {
        case 0: return pMan->nVars + c.cPhase * 1.09 + c.cPerm * 0.01144;
        case 1: return pMan->nVars + c.cPhase * 0.855 + c.cPerm * 0.00797;
        case 2: return pMan->nVars * 0.94 + c.cPhase * 0.885 + c.cPerm * 0.00855 - 20.59;
    }
    return 0;
}